

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_flattened_struct_member
          (string *__return_storage_ptr__,CompilerGLSL *this,string *basename,SPIRType *type,
          uint32_t index)

{
  undefined4 in_register_00000084;
  string local_50;
  undefined1 local_2d;
  uint32_t local_2c;
  SPIRType *pSStack_28;
  uint32_t index_local;
  SPIRType *type_local;
  string *basename_local;
  CompilerGLSL *this_local;
  string *ret;
  
  local_2d = 0;
  local_2c = index;
  pSStack_28 = type;
  type_local = (SPIRType *)basename;
  basename_local = (string *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  to_member_name_abi_cxx11_(&local_50,this,type,index);
  join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)basename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66305e,
             (char (*) [2])&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000084,index));
  ::std::__cxx11::string::~string((string *)&local_50);
  ParsedIR::sanitize_underscores(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_flattened_struct_member(const string &basename, const SPIRType &type, uint32_t index)
{
	auto ret = join(basename, "_", to_member_name(type, index));
	ParsedIR::sanitize_underscores(ret);
	return ret;
}